

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::Dress(Character *this,EquipLocation loc,unsigned_short gfx_id)

{
  Character *other;
  bool bVar1;
  uint uVar2;
  int num;
  uint *puVar3;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar4;
  Character *updatecharacter;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_48 [8];
  PacketBuilder builder;
  unsigned_short gfx_id_local;
  EquipLocation loc_local;
  Character *this_local;
  
  builder.add_size._2_2_ = gfx_id;
  if (gfx_id == 0) {
    builder.add_size._2_2_ = 0xffff;
  }
  uVar2 = (uint)builder.add_size._2_2_;
  builder.add_size._4_4_ = loc;
  puVar3 = (uint *)std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,(ulong)loc);
  *puVar3 = uVar2;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_AVATAR,PACKET_AGREE,0xe);
  num = PlayerID(this);
  PacketBuilder::AddShort((PacketBuilder *)local_48,num);
  PacketBuilder::AddChar((PacketBuilder *)local_48,1);
  PacketBuilder::AddChar((PacketBuilder *)local_48,0);
  AddPaperdollData(this,(PacketBuilder *)local_48,"BAHWS");
  this_00 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
  updatecharacter =
       (Character *)std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&updatecharacter), bVar1) {
    ppCVar4 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar4;
    bVar1 = InRange(this,other);
    if (bVar1) {
      Send(other,(PacketBuilder *)local_48);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Character::Dress(EquipLocation loc, unsigned short gfx_id)
{
	if (gfx_id == 0)
		gfx_id = 65535;

	this->cosmetic_paperdoll[loc] = gfx_id;

	PacketBuilder builder(PACKET_AVATAR, PACKET_AGREE, 14);
	builder.AddShort(this->PlayerID());
	builder.AddChar(SLOT_CLOTHES);
	builder.AddChar(0); // sound
	this->AddPaperdollData(builder, "BAHWS");

	UTIL_FOREACH(this->map->characters, updatecharacter)
	{
		if (!this->InRange(updatecharacter))
			continue;

		updatecharacter->Send(builder);
	}
}